

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5ImagesArrayIndexing.cpp
# Opt level: O0

string * __thiscall
glcts::GPUShader5ImagesArrayIndexing::getComputeShaderCode
          (string *__return_storage_ptr__,GPUShader5ImagesArrayIndexing *this,string *param_1,
          string *param_2)

{
  string *psVar1;
  ulong local_70;
  size_t template_position;
  string local_60 [8];
  string template_name;
  allocator<char> local_2a;
  byte local_29;
  string *local_28;
  string *local_size_y_local;
  string *local_size_x_local;
  GPUShader5ImagesArrayIndexing *this_local;
  string *m_compute_shader_template;
  
  local_29 = 0;
  local_28 = param_2;
  local_size_y_local = param_1;
  local_size_x_local = (string *)this;
  this_local = (GPUShader5ImagesArrayIndexing *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "${VERSION}\n\n${GPU_SHADER5_REQUIRE}\n\nlayout (local_size_x = <-MAX-LOCAL-SIZE-X->,\n        local_size_y = <-MAX-LOCAL-SIZE-Y->,\n        local_size_z = 1) in;\n\nlayout (r32ui, binding = 0) uniform highp uimage2D image[4];\n\nvoid main(void)\n{\n   uvec4 texel0 = imageLoad(image[0], ivec2(gl_LocalInvocationID.x, gl_LocalInvocationID.y) );\n   uvec4 texel1 = imageLoad(image[1], ivec2(gl_LocalInvocationID.x, gl_LocalInvocationID.y) );\n   uvec4 texel2 = imageLoad(image[2], ivec2(gl_LocalInvocationID.x, gl_LocalInvocationID.y) );\n   uvec4 texel3 = imageLoad(image[3], ivec2(gl_LocalInvocationID.x, gl_LocalInvocationID.y) );\n   uvec4 addon  = uvec4(gl_LocalInvocationID.x+gl_LocalInvocationID.y);\n\n   imageStore(image[0], ivec2( gl_LocalInvocationID.x, gl_LocalInvocationID.y), texel0  + addon);\n   imageStore(image[1], ivec2( gl_LocalInvocationID.x, gl_LocalInvocationID.y), texel1  + addon);\n   imageStore(image[2], ivec2( gl_LocalInvocationID.x, gl_LocalInvocationID.y), texel2  + addon);\n   imageStore(image[3], ivec2( gl_LocalInvocationID.x, gl_LocalInvocationID.y), texel3  + addon);\n}\n"
             ,&local_2a);
  std::allocator<char>::~allocator(&local_2a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_60,"<-MAX-LOCAL-SIZE-X->",(allocator<char> *)((long)&template_position + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&template_position + 7));
  local_70 = std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)local_60);
  while (local_70 != 0xffffffffffffffff) {
    psVar1 = (string *)std::__cxx11::string::length();
    psVar1 = (string *)std::__cxx11::string::replace((ulong)__return_storage_ptr__,local_70,psVar1);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,psVar1);
    local_70 = std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)local_60);
  }
  std::__cxx11::string::operator=(local_60,"<-MAX-LOCAL-SIZE-Y->");
  local_70 = std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)local_60);
  while (local_70 != 0xffffffffffffffff) {
    psVar1 = (string *)std::__cxx11::string::length();
    psVar1 = (string *)std::__cxx11::string::replace((ulong)__return_storage_ptr__,local_70,psVar1);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,psVar1);
    local_70 = std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)local_60);
  }
  local_29 = 1;
  std::__cxx11::string::~string(local_60);
  if ((local_29 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GPUShader5ImagesArrayIndexing::getComputeShaderCode(const std::string& local_size_x,
																const std::string& local_size_y)
{
	/* Compute shader template code */
	std::string m_compute_shader_template =
		"${VERSION}\n"
		"\n"
		"${GPU_SHADER5_REQUIRE}\n"
		"\n"
		"layout (local_size_x = <-MAX-LOCAL-SIZE-X->,\n"
		"        local_size_y = <-MAX-LOCAL-SIZE-Y->,\n"
		"        local_size_z = 1) in;\n"
		"\n"
		"layout (r32ui, binding = 0) uniform highp uimage2D image[4];\n"
		"\n"
		"void main(void)\n"
		"{\n"
		"   uvec4 texel0 = imageLoad(image[0], ivec2(gl_LocalInvocationID.x, gl_LocalInvocationID.y) );\n"
		"   uvec4 texel1 = imageLoad(image[1], ivec2(gl_LocalInvocationID.x, gl_LocalInvocationID.y) );\n"
		"   uvec4 texel2 = imageLoad(image[2], ivec2(gl_LocalInvocationID.x, gl_LocalInvocationID.y) );\n"
		"   uvec4 texel3 = imageLoad(image[3], ivec2(gl_LocalInvocationID.x, gl_LocalInvocationID.y) );\n"
		"   uvec4 addon  = uvec4(gl_LocalInvocationID.x+gl_LocalInvocationID.y);\n"
		"\n"
		"   imageStore(image[0], ivec2( gl_LocalInvocationID.x, gl_LocalInvocationID.y), texel0  + addon);\n"
		"   imageStore(image[1], ivec2( gl_LocalInvocationID.x, gl_LocalInvocationID.y), texel1  + addon);\n"
		"   imageStore(image[2], ivec2( gl_LocalInvocationID.x, gl_LocalInvocationID.y), texel2  + addon);\n"
		"   imageStore(image[3], ivec2( gl_LocalInvocationID.x, gl_LocalInvocationID.y), texel3  + addon);\n"
		"}\n";

	/* Insert information on local size in X direction */
	std::string template_name	 = "<-MAX-LOCAL-SIZE-X->";
	std::size_t template_position = m_compute_shader_template.find(template_name);

	while (template_position != std::string::npos)
	{
		m_compute_shader_template =
			m_compute_shader_template.replace(template_position, template_name.length(), local_size_x);

		template_position = m_compute_shader_template.find(template_name);
	}

	/* Insert information on local size in Y direction */
	template_name	 = "<-MAX-LOCAL-SIZE-Y->";
	template_position = m_compute_shader_template.find(template_name);

	while (template_position != std::string::npos)
	{
		m_compute_shader_template =
			m_compute_shader_template.replace(template_position, template_name.length(), local_size_y);

		template_position = m_compute_shader_template.find(template_name);
	}

	return m_compute_shader_template;
}